

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::Read
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZStream *buf,void *context)

{
  long lVar1;
  
  TPZGeoPyramid::Read(&this->super_TPZGeoPyramid,buf,context);
  for (lVar1 = 0x38; lVar1 != 0x1a0; lVar1 = lVar1 + 0x18) {
    (**(code **)(*(long *)((long)(this->super_TPZGeoPyramid).
                                 super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
                          lVar1 + -8) + 0x30))
              ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.
                     fNodeIndexes + lVar1 + -8,buf,context);
  }
  for (lVar1 = 0x1a0; lVar1 != 0x1a00; lVar1 = lVar1 + 0x1a0) {
    (**(code **)(*(long *)((long)(this->super_TPZGeoPyramid).
                                 super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
                          lVar1 + -8) + 0x30))
              ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.
                     fNodeIndexes + lVar1 + -8,buf,context);
  }
  return;
}

Assistant:

void Read(TPZStream &buf, void *context) override{
            TGeo::Read(buf, context);
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is].Read(buf, context);
            }
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fTrans[is].Read(buf, context);
            }
        }